

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void starvation_branch_with_pivot(size_t W)

{
  char *pcVar1;
  Node *v;
  code *pcVar2;
  double dVar3;
  FlowBuilder FVar4;
  char extraout_AL;
  int iVar5;
  TestCaseData *pTVar6;
  long *plVar7;
  size_t l;
  ulong uVar8;
  Executor *this;
  Node *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  size_t N;
  atomic<unsigned_long> counter;
  size_t target;
  int w;
  size_t local_300;
  shared_ptr<tf::WorkerInterface> local_2f8;
  ResultBuilder DOCTEST_RB;
  unsigned_long local_268;
  Result local_260;
  atomic<unsigned_long> *local_240;
  Enum local_238;
  Taskflow taskflow;
  Executor executor;
  
  tf::Taskflow::Taskflow(&taskflow);
  local_2f8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2f8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_300 = W;
  tf::Executor::Executor(&executor,W,&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  target = 0;
  N = 1000;
  LOCK();
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  this_00 = (Node *)0x0;
  for (uVar8 = 0; FVar4._graph = taskflow.super_FlowBuilder._graph, uVar8 < N; uVar8 = uVar8 + 1) {
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
         &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
    *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
    pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
    (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
    *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
    *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
         &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
    *(atomic<unsigned_long> **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &counter;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:103:29)>
                 ::_M_invoke;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
         (double)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:103:29)>
                 ::_M_manager;
    *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    v = ((FVar4._graph)->
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ).
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
        super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
        super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    if (uVar8 != 0) {
      tf::Node::_precede(this_00,v);
    }
    this_00 = v;
  }
  iVar5 = rand();
  w = (int)((ulong)(long)iVar5 % local_300);
  for (uVar8 = 0; uVar8 < N; uVar8 = uVar8 + 1) {
    iVar5 = rand();
    FVar4 = taskflow.super_FlowBuilder;
    if (iVar5 % 10 == 0) {
      target = target + 1;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
      ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
      *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
           &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
      *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0
      ;
      *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
      pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
      (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
      *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
      *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
      (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
      DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
      *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
           &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
      DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
      *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
      *(atomic<unsigned_long> **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &counter;
      DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
           (char *)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:128:24)>
                   ::_M_invoke;
      DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
           (double)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:128:24)>
                   ::_M_manager;
      *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
      DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
      DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB
                );
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      tf::Node::_precede(this_00,((FVar4._graph)->
                                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                 super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                                 super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl);
    }
    else {
      pTVar6 = (TestCaseData *)operator_new(0xd8);
      (pTVar6->m_file).field_0.data.ptr = (char *)0x0;
      *(uint **)((long)&(pTVar6->m_file).field_0 + 8) = &pTVar6->m_line;
      *(undefined8 *)((long)&(pTVar6->m_file).field_0 + 0x10) = 0;
      *(undefined1 *)&pTVar6->m_line = 0;
      pcVar1 = (char *)((long)&pTVar6[1].m_file.field_0 + 0x10);
      pTVar6->m_test_suite = (char *)0x0;
      pTVar6->m_description = (char *)0x0;
      pTVar6->m_skip = false;
      pTVar6->m_no_breaks = false;
      pTVar6->m_no_output = false;
      pTVar6->m_may_fail = false;
      pTVar6->m_should_fail = false;
      *(undefined3 *)&pTVar6->field_0x3d = 0;
      *(undefined8 *)&pTVar6->m_expected_failures = 0;
      pTVar6->m_timeout = (double)pcVar1;
      pTVar6[1].m_file.field_0.data.ptr = pcVar1;
      *(char ***)((long)&pTVar6[1].m_file.field_0 + 8) = &pTVar6[1].m_description;
      pTVar6[1].m_description = (char *)0x0;
      pTVar6[1].m_skip = false;
      pTVar6[1].m_no_breaks = false;
      pTVar6[1].m_no_output = false;
      pTVar6[1].m_may_fail = false;
      pTVar6[1].m_should_fail = false;
      *(undefined3 *)&pTVar6[1].field_0x3d = 0;
      *(undefined8 *)&pTVar6[1].m_expected_failures = 0;
      pTVar6[1].m_timeout = 0.0;
      pTVar6[2].m_file.field_0.data.ptr = (char *)0x0;
      plVar7 = (long *)operator_new(0x28);
      *plVar7 = (long)&executor;
      plVar7[1] = (long)&w;
      plVar7[2] = (long)&counter;
      plVar7[3] = (long)&target;
      plVar7[4] = (long)&N;
      *(long **)&pTVar6[1].m_skip = plVar7;
      pTVar6[2].m_file.field_0.data.ptr =
           (char *)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:117:24)>
                   ::_M_invoke;
      pTVar6[1].m_timeout =
           (double)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:117:24)>
                   ::_M_manager;
      *(undefined1 *)&pTVar6[2].m_name = 1;
      pTVar6[2].m_test_suite = (char *)0x0;
      pTVar6[2].m_description = (char *)0x0;
      DOCTEST_RB.super_AssertData.m_test_case = pTVar6;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB
                );
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      tf::Node::_precede(this_00,((FVar4._graph)->
                                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                 super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                                 super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl);
    }
  }
  this = &executor;
  tf::Executor::run((Future<void> *)&DOCTEST_RB,this,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB,this);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x88;
  DOCTEST_RB.super_AssertData.m_expr = "counter == target + N";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_240 = &counter;
  local_268 = N + target;
  local_238 = DOCTEST_RB.super_AssertData.m_at;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (&local_260,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_240,&local_268);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_260);
  doctest::String::~String(&local_260.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void starvation_branch_with_pivot(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  std::atomic<size_t> counter{0};

  tf::Task prev, curr;
  
  // large linear chain followed by many branches
  size_t N = 1000;
  size_t target = 0;
  counter = 0;
  
  for(size_t l=0; l<N; l++) {
    curr = taskflow.emplace([&](){
      counter.fetch_add(1, std::memory_order_relaxed);
    });
    if(l) {
      curr.succeed(prev);
    }
    prev = curr;
  }

  const int w = rand() % W;

  for(size_t b=0; b<N; b++) {
    // wait with a probability of 0.9
    if(rand() % 10 != 0) {
      taskflow.emplace([&](){ 
        if(executor.this_worker_id() != w) {
          while(counter.load(std::memory_order_relaxed) != target + N) {
            std::this_thread::yield();
          }
        }
      }).succeed(curr);
    }
    // increment the counter with a probability of 0.1
    else {
      target++;
      taskflow.emplace([&](){ 
        counter.fetch_add(1, std::memory_order_relaxed);
      }).succeed(curr);
    }
  }

  executor.run(taskflow).wait();

  REQUIRE(counter == target + N);
  
}